

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O3

void EMIT_OP_RPTR_NUM(CodeGenGenericContext *ctx,x86Command op,x86Size size,x86Reg index,
                     int multiplier,x86Reg base,uint shift,uint num)

{
  x86Instruction *pxVar1;
  x86Argument arg_00;
  x86Argument arg_01;
  uint uVar2;
  int iVar3;
  x86Reg xVar4;
  x86Reg xVar5;
  ulong uVar6;
  x86Argument arg;
  int local_7c;
  x86Reg local_78;
  x86Reg local_74;
  x86Argument local_70;
  x86Argument local_50;
  
  local_7c = multiplier;
  local_78 = base;
  local_74 = index;
  if (ctx->skipTracking == false) {
    CodeGenGenericContext::RedirectAddressComputation(ctx,&local_74,&local_7c,&local_78,&shift);
    ctx->genRegRead[local_78] = true;
    ctx->genRegRead[local_74] = true;
  }
  xVar5 = local_74;
  xVar4 = local_78;
  iVar3 = local_7c;
  uVar2 = shift;
  local_70.type = argPtr;
  uVar6 = (ulong)(op - o_add);
  local_70.field_1.ptrSize = size;
  local_70.ptrBase = local_78;
  local_70.ptrIndex = local_74;
  local_70.ptrMult = local_7c;
  local_70.ptrNum = shift;
  if (op - o_add < 0x3d) {
    if ((0xecc000000001dcfU >> (uVar6 & 0x3f) & 1) != 0) {
      if (ctx->skipTracking == false) {
        CodeGenGenericContext::MemRead(ctx,&local_70);
        arg_00._4_4_ = local_70._4_4_;
        arg_00.type = local_70.type;
        arg_00.field_1.imm64Arg._4_4_ = local_70.field_1.imm64Arg._4_4_;
        arg_00.field_1.ptrSize = local_70.field_1.reg;
        arg_00.ptrIndex = local_70.ptrIndex;
        arg_00.ptrBase = local_70.ptrBase;
        arg_00.ptrNum = local_70.ptrNum;
        arg_00.ptrMult = local_70.ptrMult;
        CodeGenGenericContext::InvalidateAddressValue(ctx,arg_00);
        local_50.type = argNone;
        local_50.field_1.imm64Arg = 0;
        local_50.ptrBase = rNONE;
        local_50.ptrIndex = rNONE;
        local_50.ptrMult = 0;
        local_50.ptrNum = 0;
        CodeGenGenericContext::MemWrite(ctx,&local_70,&local_50);
      }
      goto LAB_001dd73a;
    }
    if ((0x1000000000002000U >> (uVar6 & 0x3f) & 1) != 0) {
      CodeGenGenericContext::MemRead(ctx,&local_70);
      goto LAB_001dd73a;
    }
    if (uVar6 != 0x30) goto LAB_001dd7a6;
  }
  else {
LAB_001dd7a6:
    if (op != o_mov) {
      __assert_fail("!\"unknown instruction\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                    ,0x7ae,
                    "void EMIT_OP_RPTR_NUM(CodeGenGenericContext &, x86Command, x86Size, x86Reg, int, x86Reg, unsigned int, unsigned int)"
                   );
    }
  }
  if (ctx->skipTracking == false) {
    if (local_78 == rESP) {
      __assert_fail("base != rESP",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                    ,0x786,
                    "void EMIT_OP_RPTR_NUM(CodeGenGenericContext &, x86Command, x86Size, x86Reg, int, x86Reg, unsigned int, unsigned int)"
                   );
    }
    arg_01._4_4_ = local_70._4_4_;
    arg_01.type = 4;
    arg_01.field_1.imm64Arg._4_4_ = local_70.field_1.imm64Arg._4_4_;
    arg_01.field_1.ptrSize = size;
    arg_01.ptrIndex = local_74;
    arg_01.ptrBase = local_78;
    arg_01.ptrNum = shift;
    arg_01.ptrMult = local_7c;
    CodeGenGenericContext::InvalidateAddressValue(ctx,arg_01);
    CodeGenGenericContext::MemKillDeadStore(ctx,&local_70);
    local_50.type = argNumber;
    local_50.field_1.labelID = num;
    local_50.ptrBase = rNONE;
    local_50.ptrIndex = rNONE;
    local_50.ptrMult = 0;
    local_50.ptrNum = 0;
    CodeGenGenericContext::MemWrite(ctx,&local_70,&local_50);
  }
LAB_001dd73a:
  pxVar1 = ctx->x86Op;
  pxVar1->name = op;
  (pxVar1->argA).type = argPtr;
  (pxVar1->argA).field_1.ptrSize = size;
  pxVar1 = ctx->x86Op;
  (pxVar1->argA).ptrIndex = xVar5;
  (pxVar1->argA).ptrMult = iVar3;
  (pxVar1->argA).ptrBase = xVar4;
  (pxVar1->argA).ptrNum = uVar2;
  (pxVar1->argB).type = argNumber;
  (pxVar1->argB).field_1.labelID = num;
  ctx->x86Op = ctx->x86Op + 1;
  return;
}

Assistant:

void EMIT_OP_RPTR_NUM(CodeGenGenericContext &ctx, x86Command op, x86Size size, x86Reg index, int multiplier, x86Reg base, unsigned shift, unsigned num)
{
#ifdef NULLC_OPTIMIZE_X86
	if(!ctx.skipTracking)
	{
		ctx.RedirectAddressComputation(index, multiplier, base, shift);

		// Register reads
		ctx.ReadRegister(base);
		ctx.ReadRegister(index);
	}

	x86Argument arg = x86Argument(size, index, multiplier, base, shift);

	switch(op)
	{
	case o_mov:
	case o_mov64:
		if(ctx.skipTracking)
			break;

		assert(base != rESP);

		ctx.InvalidateAddressValue(arg);

		ctx.MemKillDeadStore(arg);

		// Track target memory value
		ctx.MemWrite(arg, x86Argument(num));
		break;
	case o_add:
	case o_sub:
	case o_adc:
	case o_sbb:
	case o_shl:
	case o_sal:
	case o_sar:
	case o_and:
	case o_or:
	case o_xor:
	case o_add64:
	case o_sub64:
	case o_sal64:
	case o_sar64:
	case o_and64:
	case o_or64:
	case o_xor64:
		if(ctx.skipTracking)
			break;

		ctx.MemRead(arg);

		ctx.InvalidateAddressValue(arg);

		ctx.MemWrite(arg, x86Argument());
		break;
	case o_cmp:
	case o_cmp64:
		ctx.MemRead(arg);
		break;
	default:
		assert(!"unknown instruction");
	}
#endif

	ctx.x86Op->name = op;
	ctx.x86Op->argA.type = x86Argument::argPtr;
	ctx.x86Op->argA.ptrSize = size;
	ctx.x86Op->argA.ptrIndex = index;
	ctx.x86Op->argA.ptrMult = multiplier;
	ctx.x86Op->argA.ptrBase = base;
	ctx.x86Op->argA.ptrNum = shift;
	ctx.x86Op->argB.type = x86Argument::argNumber;
	ctx.x86Op->argB.num = num;
	ctx.x86Op++;
}